

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.c
# Opt level: O1

void prvTidyRemoveAttribute(TidyDocImpl *doc,Node *node,AttVal *attr)

{
  AttVal *pAVar1;
  AttVal *pAVar2;
  AttVal *pAVar3;
  
  pAVar2 = (AttVal *)&node->attributes;
  pAVar1 = (AttVal *)0x0;
  do {
    pAVar3 = pAVar1;
    pAVar2 = pAVar2->next;
    if (pAVar2 == (AttVal *)0x0) goto LAB_001322c4;
    pAVar1 = pAVar2;
  } while (pAVar2 != attr);
  pAVar2 = (AttVal *)&node->attributes;
  if (pAVar3 != (AttVal *)0x0) {
    pAVar2 = pAVar3;
  }
  pAVar2->next = attr->next;
LAB_001322c4:
  prvTidyFreeAttribute(doc,attr);
  return;
}

Assistant:

void TY_(DetachAttribute)( Node *node, AttVal *attr )
{
    AttVal *av, *prev = NULL;

    for ( av = node->attributes; av; av = av->next )
    {
        if ( av == attr )
        {
            if ( prev )
                prev->next = attr->next;
            else
                node->attributes = attr->next;
            break;
        }
        prev = av;
    }
}